

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Figure.hpp
# Opt level: O3

void __thiscall sciplot::Figure::save(Figure *this,string *filename)

{
  pointer pcVar1;
  size_type sVar2;
  size_t columns;
  pointer pvVar3;
  pointer pPVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  vector<sciplot::Plot,_std::allocator<sciplot::Plot>_> *row;
  pointer pvVar9;
  undefined1 in_R8B;
  string *psVar10;
  pointer pPVar11;
  gnuplot *this_00;
  Plot *plot;
  size_t sVar12;
  undefined1 auVar13 [16];
  double dVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> extension;
  string size;
  string cleanedfilename;
  ofstream script;
  string local_590;
  long *local_570;
  long local_568;
  long local_560 [2];
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_430;
  filebuf local_428 [240];
  ios_base local_338 [264];
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_450,pcVar1,pcVar1 + filename->_M_string_length);
  gnuplot::cleanpath(&local_490,&local_450);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::rfind((char *)&local_490,0x18c507,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_570,(ulong)&local_490);
  std::ofstream::ofstream(&local_430,(string *)&this->m_scriptfilename,_S_out);
  sVar2 = (this->m_palette)._M_string_length;
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  if (sVar2 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"dark2","");
  }
  else {
    pcVar1 = (this->m_palette)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_590,pcVar1,pcVar1 + sVar2);
  }
  gnuplot::palettecmd((ostream *)&local_430,&local_590);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  sVar12 = this->m_width;
  auVar13._8_4_ = (int)(sVar12 >> 0x20);
  auVar13._0_8_ = sVar12;
  auVar13._12_4_ = 0x45300000;
  dVar14 = (auVar13._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar12) - 4503599627370496.0);
  uVar8 = (ulong)dVar14;
  this_00 = (gnuplot *)0x143;
  if (sVar12 != 0) {
    this_00 = (gnuplot *)((long)(dVar14 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8);
  }
  sVar12 = 200;
  if (this->m_height != 0) {
    sVar12 = this->m_height;
  }
  iVar7 = std::__cxx11::string::compare((char *)&local_570);
  gnuplot::sizestr_abi_cxx11_(&local_4b0,this_00,sVar12,(ulong)(iVar7 == 0),(bool)in_R8B);
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d0,local_570,local_568 + (long)local_570);
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4f0,local_4b0._M_dataplus._M_p,
             local_4b0._M_dataplus._M_p + local_4b0._M_string_length);
  (**(code **)(*(long *)(&(this->m_font).super_FontSpecsOf<sciplot::FontSpecs>.field_0x0 +
                        *(long *)(*(long *)&(this->m_font).super_FontSpecsOf<sciplot::FontSpecs> +
                                 -0x28)) + 0x10))(&local_470);
  gnuplot::saveterminalcmd((ostream *)&local_430,&local_4d0,&local_4f0,&local_470);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_510,local_490._M_dataplus._M_p,
             local_490._M_dataplus._M_p + local_490._M_string_length);
  gnuplot::outputcmd((ostream *)&local_430,&local_510);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  sVar12 = this->m_layoutrows;
  columns = this->m_layoutcols;
  pcVar1 = (this->m_title)._M_dataplus._M_p;
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_530,pcVar1,pcVar1 + (this->m_title)._M_string_length);
  gnuplot::multiplotcmd((ostream *)&local_430,sVar12,columns,&local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  pvVar9 = (this->m_plots).
           super__Vector_base<std::vector<sciplot::Plot,_std::allocator<sciplot::Plot>_>,_std::allocator<std::vector<sciplot::Plot,_std::allocator<sciplot::Plot>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->m_plots).
           super__Vector_base<std::vector<sciplot::Plot,_std::allocator<sciplot::Plot>_>,_std::allocator<std::vector<sciplot::Plot,_std::allocator<sciplot::Plot>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar9 != pvVar3) {
    do {
      pPVar4 = (pvVar9->super__Vector_base<sciplot::Plot,_std::allocator<sciplot::Plot>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pPVar11 = (pvVar9->super__Vector_base<sciplot::Plot,_std::allocator<sciplot::Plot>_>).
                     _M_impl.super__Vector_impl_data._M_start; pPVar11 != pPVar4;
          pPVar11 = pPVar11 + 1) {
        Plot::repr_abi_cxx11_((string *)local_230,pPVar11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_430,(char *)local_230,local_228);
        if (local_230 != (undefined1  [8])local_220) {
          operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
        }
      }
      pvVar9 = pvVar9 + 1;
    } while (pvVar9 != pvVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,"unset multiplot",0xf);
  std::ios::widen((char)(ostream *)&local_430 +
                  (char)*(undefined8 *)(local_430->_M_local_buf + -0x18));
  std::ostream::put((char)&local_430);
  std::ostream::flush();
  std::ios::widen((char)&local_430 + (char)*(undefined8 *)(local_430->_M_local_buf + -0x18));
  std::ostream::put((char)&local_430);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_430,"set output",10);
  std::ios::widen((char)(ostream *)&local_430 +
                  (char)*(undefined8 *)(local_430->_M_local_buf + -0x18));
  std::ostream::put((char)&local_430);
  std::ostream::flush();
  std::ofstream::close();
  uVar6 = _memcpy;
  paVar5 = _VTT;
  pvVar9 = (this->m_plots).
           super__Vector_base<std::vector<sciplot::Plot,_std::allocator<sciplot::Plot>_>,_std::allocator<std::vector<sciplot::Plot,_std::allocator<sciplot::Plot>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->m_plots).
           super__Vector_base<std::vector<sciplot::Plot,_std::allocator<sciplot::Plot>_>,_std::allocator<std::vector<sciplot::Plot,_std::allocator<sciplot::Plot>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar9 != pvVar3) {
    do {
      pPVar11 = (pvVar9->super__Vector_base<sciplot::Plot,_std::allocator<sciplot::Plot>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pPVar4 = (pvVar9->super__Vector_base<sciplot::Plot,_std::allocator<sciplot::Plot>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pPVar11 != pPVar4) {
        psVar10 = (string *)&pPVar11->m_datafilename;
        do {
          if (*(long *)(psVar10 + 0x28) != 0) {
            std::ofstream::ofstream((ostream *)local_230,psVar10,_S_out);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_230,*(char **)(psVar10 + 0x20),*(long *)(psVar10 + 0x28));
            local_230 = (undefined1  [8])paVar5;
            *(undefined8 *)(local_230 + *(long *)(paVar5->_M_local_buf + -0x18)) = uVar6;
            std::filebuf::~filebuf((filebuf *)&local_228);
            std::ios_base::~ios_base(local_138);
          }
          pPVar11 = (pointer)(psVar10 + 0x1e10);
          psVar10 = psVar10 + 0x1e70;
        } while (pPVar11 != pPVar4);
      }
      pvVar9 = pvVar9 + 1;
    } while (pvVar9 != pvVar3);
  }
  pcVar1 = (this->m_scriptfilename)._M_dataplus._M_p;
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_550,pcVar1,pcVar1 + (this->m_scriptfilename)._M_string_length);
  gnuplot::runscript(&local_550,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  if (this->m_autoclean == true) {
    remove((this->m_scriptfilename)._M_dataplus._M_p);
    pvVar3 = (this->m_plots).
             super__Vector_base<std::vector<sciplot::Plot,_std::allocator<sciplot::Plot>_>,_std::allocator<std::vector<sciplot::Plot,_std::allocator<sciplot::Plot>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar9 = (this->m_plots).
                  super__Vector_base<std::vector<sciplot::Plot,_std::allocator<sciplot::Plot>_>,_std::allocator<std::vector<sciplot::Plot,_std::allocator<sciplot::Plot>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar9 != pvVar3; pvVar9 = pvVar9 + 1)
    {
      pPVar4 = (pvVar9->super__Vector_base<sciplot::Plot,_std::allocator<sciplot::Plot>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pPVar11 = (pvVar9->super__Vector_base<sciplot::Plot,_std::allocator<sciplot::Plot>_>).
                     _M_impl.super__Vector_impl_data._M_start; pPVar11 != pPVar4;
          pPVar11 = pPVar11 + 1) {
        remove((pPVar11->m_scriptfilename)._M_dataplus._M_p);
        remove((pPVar11->m_datafilename)._M_dataplus._M_p);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  local_430 = _VTT;
  *(undefined8 *)(local_428 + *(long *)(_VTT->_M_local_buf + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_428);
  std::ios_base::~ios_base(local_338);
  if (local_570 != local_560) {
    operator_delete(local_570,local_560[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline auto Figure::save(const std::string& filename) const -> void
{
    // Clean the file name to prevent errors
    auto cleanedfilename = gnuplot::cleanpath(filename);

    // Get extension from file name
    auto extension = cleanedfilename.substr(cleanedfilename.rfind(".") + 1);

    // Open script file
    std::ofstream script(m_scriptfilename);

    // Add palette info. Use default palette if the user hasn't set one
    gnuplot::palettecmd(script, m_palette.empty() ? internal::DEFAULT_PALETTE : m_palette);

    // Add terminal info
    auto width = m_width == 0 ? internal::DEFAULT_FIGURE_WIDTH : m_width;
    auto height = m_height == 0 ? internal::DEFAULT_FIGURE_HEIGHT : m_height;
    std::string size = gnuplot::sizestr(width, height, extension == "pdf");
    gnuplot::saveterminalcmd(script, extension, size, m_font);

    // Add output command
    gnuplot::outputcmd(script, cleanedfilename);

    // Add multiplot commands
    gnuplot::multiplotcmd(script, m_layoutrows, m_layoutcols, m_title);

    // Add the plot commands
    for(const auto& row : m_plots)
        for(const auto& plot : row)
            script << plot.repr();

    // Close multiplot
    script << "unset multiplot" << std::endl;

    // Unset the output
    script << std::endl;
    script << "set output";

    // Add an empty line at the end and close the script to avoid crashes with gnuplot
    script << std::endl;
    script.close();

    // save plot data to file(s)
    saveplotdata();

    // Save the figure as a file
    gnuplot::runscript(m_scriptfilename, false);

    // remove the temporary files if user wants to
    if(m_autoclean)
    {
        cleanup();
    }
}